

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExpressionResultBuilder::ExpressionResultBuilder
          (ExpressionResultBuilder *this,ExpressionResultBuilder *other)

{
  long in_RDI;
  AssertionResultData *in_stack_ffffffffffffffb8;
  ExprComponents *in_stack_ffffffffffffffc0;
  
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ExprComponents::ExprComponents(in_stack_ffffffffffffffc0,(ExprComponents *)(in_RDI + 0x48));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 0xb0));
  std::__cxx11::ostringstream::str();
  std::operator<<((ostream *)(in_RDI + 0xb0),(string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

ExpressionResultBuilder::ExpressionResultBuilder( ExpressionResultBuilder const& other )
    :   m_data( other.m_data ),
        m_exprComponents( other.m_exprComponents )
    {
        m_stream << other.m_stream.str();
    }